

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
 __thiscall
anon_unknown.dwarf_2e1d52a::InferScript
          (anon_unknown_dwarf_2e1d52a *this,CScript *script,ParseScriptContext ctx,
          SigningProvider *provider)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  undefined8 *puVar4;
  uchar *data_00;
  pointer puVar5;
  _Tuple_impl<0UL,_(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
  _Var6;
  pointer piVar7;
  _Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false> _Var8;
  undefined4 threshold;
  undefined8 uVar9;
  undefined1 uVar10;
  bool bVar11;
  TxoutType TVar12;
  int iVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  PKDescriptor *pPVar14;
  MultiADescriptor *this_00;
  MultisigDescriptor *this_01;
  CRIPEMD160 *this_02;
  TRDescriptor *this_03;
  MiniscriptDescriptor *this_04;
  AddressDescriptor *this_05;
  RawDescriptor *this_06;
  uint uVar15;
  uint uVar16;
  size_t __n;
  undefined8 uVar17;
  undefined8 uVar18;
  pointer __p;
  ulong uVar19;
  Node<unsigned_int> *pNVar20;
  long lVar21;
  long in_FS_OFFSET;
  vector<int,_std::allocator<int>_> depths;
  vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  subscripts;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  data;
  CTxDestination dest;
  iterator it;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  keys;
  XOnlyPubKey key;
  _Head_base<0UL,_(anonymous_namespace)::TRDescriptor_*,_false> local_1c8;
  PubkeyProvider *local_1c0;
  PubkeyProvider *local_1b8;
  iterator iStack_1b0;
  int *local_1a8;
  vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  local_198;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_178;
  vector<int,_std::allocator<int>_> local_158;
  _Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false> local_140;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_138;
  char local_f0;
  direct_or_indirect local_e8;
  uint local_cc;
  _Storage<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false>
  local_c8;
  byte local_b0;
  undefined1 local_a8 [56];
  undefined1 auStack_70 [16];
  MiniscriptContext local_60;
  uint32_t local_5c;
  _Base_ptr local_58;
  MaxInt<unsigned_int> local_50;
  MaxInt<unsigned_int> local_48;
  size_t local_40;
  __uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
  local_38;
  
  local_38._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
  .super__Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false>._M_head_impl =
       *(tuple<(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
         *)(in_FS_OFFSET + 0x28);
  if (ctx == P2TR) {
    if ((((script->super_CScriptBase)._size == 0x3f) &&
        (pcVar3 = (script->super_CScriptBase)._union.indirect_contents.indirect, *pcVar3 == ' ')) &&
       (pcVar3[0x21] == -0x54)) {
      local_a8._0_8_ = *(undefined8 *)(pcVar3 + 1);
      local_a8._8_8_ = *(undefined8 *)(pcVar3 + 9);
      local_a8._16_8_ = *(undefined8 *)(pcVar3 + 0x11);
      local_a8._24_8_ = *(undefined8 *)(pcVar3 + 0x19);
      InferXOnlyPubkey((XOnlyPubKey *)&local_e8.indirect_contents,(ParseScriptContext)local_a8,
                       provider);
      pPVar14 = (PKDescriptor *)operator_new(0x60);
      local_138._0_8_ = local_e8.indirect_contents.indirect;
      PKDescriptor::PKDescriptor
                (pPVar14,(unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                          *)&local_138._M_first,true);
      if ((Node<unsigned_int> *)local_138._0_8_ != (Node<unsigned_int> *)0x0) {
        (**(code **)(*(long *)local_138._0_8_ + 8))();
      }
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      *(PKDescriptor **)this = pPVar14;
      std::
      unique_ptr<(anonymous_namespace)::PKDescriptor,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
      ::~unique_ptr((unique_ptr<(anonymous_namespace)::PKDescriptor,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
                     *)&local_c8._M_value);
      goto LAB_006fc210;
    }
    MatchMultiA((optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
                 *)local_a8,script);
    if ((bool)local_a8[0x20] == false) {
      *(undefined8 *)this = 0;
      bVar11 = true;
      uVar10 = 0;
    }
    else {
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ::reserve((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                 *)&local_c8._M_value,(long)(local_a8._16_8_ - local_a8._8_8_) >> 4);
      uVar17 = local_a8._16_8_;
      if (local_a8._8_8_ != local_a8._16_8_) {
        pNVar20 = (Node<unsigned_int> *)local_a8._8_8_;
        do {
          if ((pNVar20->keys).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x20) {
LAB_006fb2e3:
            *(undefined8 *)this = 0;
            bVar11 = true;
            goto LAB_006fb2f1;
          }
          puVar4 = *(undefined8 **)pNVar20;
          local_138._0_8_ = *puVar4;
          local_138._8_8_ = puVar4[1];
          local_138._16_8_ = puVar4[2];
          local_138._24_8_ = puVar4[3];
          InferXOnlyPubkey((XOnlyPubKey *)&local_e8.indirect_contents,(ParseScriptContext)&local_138
                           ,provider);
          if ((Node<unsigned_int> *)local_e8.indirect_contents.indirect == (Node<unsigned_int> *)0x0
             ) goto LAB_006fb2e3;
          std::
          vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
          ::
          emplace_back<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
                    ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                      *)&local_c8._M_value,
                     (unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                      *)&local_e8.indirect_contents);
          if ((Node<unsigned_int> *)local_e8.indirect_contents.indirect != (Node<unsigned_int> *)0x0
             ) {
            (**(code **)(*(long *)local_e8.indirect_contents.indirect + 8))();
          }
          pNVar20 = (Node<unsigned_int> *)
                    &(pNVar20->keys).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        } while (pNVar20 != (Node<unsigned_int> *)uVar17);
      }
      threshold = local_a8._0_4_;
      this_00 = (MultiADescriptor *)operator_new(0x60);
      local_138._0_8_ =
           local_c8._M_value.
           super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_138._8_8_ =
           local_c8._M_value.
           super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_138._16_8_ =
           local_c8._M_value.
           super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      MultiADescriptor::MultiADescriptor
                (this_00,threshold,
                 (vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                  *)&local_138._M_first,false);
      std::
      vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ::~vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                 *)&local_138._M_first);
      local_e8.indirect_contents.indirect = (char *)0x0;
      *(MultiADescriptor **)this = this_00;
      std::
      unique_ptr<(anonymous_namespace)::MultiADescriptor,_std::default_delete<(anonymous_namespace)::MultiADescriptor>_>
      ::~unique_ptr((unique_ptr<(anonymous_namespace)::MultiADescriptor,_std::default_delete<(anonymous_namespace)::MultiADescriptor>_>
                     *)&local_e8.indirect_contents);
      bVar11 = false;
LAB_006fb2f1:
      std::
      vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ::~vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                 *)&local_c8._M_value);
      uVar10 = local_a8[0x20];
    }
    if (((uVar10 & 1) != 0) &&
       (local_a8._32_8_ = local_a8._32_8_ & 0xffffffffffffff00,
       (Node<unsigned_int> *)local_a8._8_8_ != (Node<unsigned_int> *)0x0)) {
      operator_delete((void *)local_a8._8_8_,local_a8._24_8_ - local_a8._8_8_);
    }
    if (!bVar11) goto LAB_006fc210;
    *(undefined8 *)this = 0;
  }
  local_178.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar12 = Solver(script,&local_178);
  switch(TVar12) {
  case PUBKEY:
    if ((ctx < P2TR) && (ctx != P2WPKH)) {
      CPubKey::Set<unsigned_char_const*>
                ((CPubKey *)local_a8,
                 ((local_178.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start,
                 ((local_178.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish);
      InferPubkey((anon_unknown_dwarf_2e1d52a *)&local_c8._M_value,(CPubKey *)local_a8,ctx,provider)
      ;
      uVar17 = local_c8._M_value.
               super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((Node<unsigned_int> *)
          local_c8._M_value.
          super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (Node<unsigned_int> *)0x0) {
        pPVar14 = (PKDescriptor *)operator_new(0x60);
        local_138._0_8_ = uVar17;
        PKDescriptor::PKDescriptor
                  (pPVar14,(unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                            *)&local_138._M_first,false);
        if ((Node<unsigned_int> *)local_138._0_8_ != (Node<unsigned_int> *)0x0) {
          (**(code **)(*(long *)local_138._0_8_ + 8))();
        }
        local_e8.indirect_contents.indirect = (char *)0x0;
        *(PKDescriptor **)this = pPVar14;
        std::
        unique_ptr<(anonymous_namespace)::PKDescriptor,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
        ::~unique_ptr((unique_ptr<(anonymous_namespace)::PKDescriptor,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
                       *)&local_e8.indirect_contents);
        goto LAB_006fc206;
      }
    }
    break;
  case PUBKEYHASH:
    if ((ctx < P2TR) && (ctx != P2WPKH)) {
      puVar5 = ((local_178.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)((local_178.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar5 != 0x14) {
LAB_006fc262:
        __assert_fail("vch.size() == WIDTH",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/uint256.h"
                      ,0x2a,"base_blob<160>::base_blob(Span<const unsigned char>) [BITS = 160]");
      }
      local_138._16_4_ = *(undefined4 *)(puVar5 + 0x10);
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)*(undefined8 *)puVar5;
      local_138._0_8_ = *(undefined8 *)puVar5;
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)*(undefined8 *)(puVar5 + 8);
      local_138._8_8_ = *(undefined8 *)(puVar5 + 8);
      local_c8._16_4_ = *(undefined4 *)(puVar5 + 0x10);
      local_a8[0] = 0xff;
      iVar13 = (*provider->_vptr_SigningProvider[4])();
      if (((char)iVar13 != '\0') &&
         (InferPubkey((anon_unknown_dwarf_2e1d52a *)&local_e8.indirect_contents,(CPubKey *)local_a8,
                      ctx,provider),
         (Node<unsigned_int> *)local_e8.indirect_contents.indirect != (Node<unsigned_int> *)0x0)) {
        std::
        make_unique<(anonymous_namespace)::PKHDescriptor,std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
                  ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                    *)&local_158);
        piVar7 = local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        *(pointer *)this = piVar7;
        std::
        unique_ptr<(anonymous_namespace)::PKHDescriptor,_std::default_delete<(anonymous_namespace)::PKHDescriptor>_>
        ::~unique_ptr((unique_ptr<(anonymous_namespace)::PKHDescriptor,_std::default_delete<(anonymous_namespace)::PKHDescriptor>_>
                       *)&local_158);
LAB_006fb740:
        if ((Node<unsigned_int> *)local_e8.indirect_contents.indirect != (Node<unsigned_int> *)0x0)
        {
          (**(code **)(*(long *)local_e8.indirect_contents.indirect + 8))();
        }
        goto LAB_006fc206;
      }
    }
    break;
  default:
switchD_006fb380_caseD_4:
    if (TVar12 != SCRIPTHASH || ctx != TOP) break;
    puVar5 = ((local_178.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)((local_178.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar5 != 0x14) goto LAB_006fc262;
    local_138._16_4_ = *(undefined4 *)(puVar5 + 0x10);
    local_138._0_8_ = *(undefined8 *)puVar5;
    local_138._8_8_ = *(undefined8 *)(puVar5 + 8);
    local_c8._16_4_ = *(undefined4 *)(puVar5 + 0x10);
    local_a8._16_8_ = (Node<unsigned_int> *)0x0;
    local_a8._24_8_ = (Node<unsigned_int> *)0x0;
    local_a8._0_8_ = (Node<unsigned_int> *)0x0;
    local_a8._8_8_ = (Node<unsigned_int> *)0x0;
    local_c8._M_value.
    super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_138._0_8_;
    local_c8._M_value.
    super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_138._8_8_;
    iVar13 = (*provider->_vptr_SigningProvider[2])();
    if (((char)iVar13 == '\0') ||
       (InferScript((anon_unknown_dwarf_2e1d52a *)&local_e8.indirect_contents,(CScript *)local_a8,
                    P2SH,provider),
       (Node<unsigned_int> *)local_e8.indirect_contents.indirect == (Node<unsigned_int> *)0x0)) {
      if (0x1c < (uint)local_a8._28_4_) {
        free((void *)local_a8._0_8_);
      }
      goto LAB_006fc0ad;
    }
    std::
    make_unique<(anonymous_namespace)::SHDescriptor,std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>>
              ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                *)&local_158);
    piVar7 = local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    *(pointer *)this = piVar7;
    std::
    unique_ptr<(anonymous_namespace)::SHDescriptor,_std::default_delete<(anonymous_namespace)::SHDescriptor>_>
    ::~unique_ptr((unique_ptr<(anonymous_namespace)::SHDescriptor,_std::default_delete<(anonymous_namespace)::SHDescriptor>_>
                   *)&local_158);
    uVar17 = local_e8.indirect_contents.indirect;
    goto LAB_006fbb7c;
  case MULTISIG:
    if ((P2WSH < ctx) || (ctx == P2WPKH)) break;
    local_138._0_8_ = (Node<unsigned_int> *)0x0;
    local_138._8_8_ = (Node<unsigned_int> *)0x0;
    local_138._16_8_ = (Node<unsigned_int> *)0x0;
    if (2 < (ulong)(((long)local_178.
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_178.
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
      uVar19 = 2;
      lVar21 = 0x20;
      do {
        CPubKey::Set<unsigned_char_const*>
                  ((CPubKey *)local_a8,
                   *(uchar **)
                    ((long)local_178.
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar21 + -8),
                   *(uchar **)
                    ((long)&((local_178.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start + lVar21));
        InferPubkey((anon_unknown_dwarf_2e1d52a *)&local_c8._M_value,(CPubKey *)local_a8,ctx,
                    provider);
        if ((Node<unsigned_int> *)
            local_c8._M_value.
            super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start == (Node<unsigned_int> *)0x0) {
          std::
          vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
          ::~vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                     *)&local_138._M_first);
          goto switchD_006fb380_caseD_4;
        }
        std::
        vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
        ::
        emplace_back<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
                  ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                    *)&local_138._M_first,
                   (unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                    *)&local_c8._M_value);
        if ((Node<unsigned_int> *)
            local_c8._M_value.
            super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (Node<unsigned_int> *)0x0) {
          (**(code **)((((direct_or_indirect *)
                        &(local_c8._M_value.
                          super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                         super__Tuple_impl<0UL,_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>
                        )->indirect_contents).indirect + 8))();
        }
        uVar19 = uVar19 + 1;
        lVar21 = lVar21 + 0x18;
      } while (uVar19 < (ulong)(((long)local_178.
                                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_178.
                                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
    bVar1 = *((local_178.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    this_01 = (MultisigDescriptor *)operator_new(0x60);
    local_a8._0_8_ = local_138._0_8_;
    local_a8._8_8_ = local_138._8_8_;
    local_a8._16_8_ = local_138._16_8_;
    local_138._0_8_ = (Node<unsigned_int> *)0x0;
    local_138._8_8_ = (Node<unsigned_int> *)0x0;
    local_138._16_8_ = (Node<unsigned_int> *)0x0;
    MultisigDescriptor::MultisigDescriptor
              (this_01,(uint)bVar1,
               (vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                *)local_a8,false);
    std::
    vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
    ::~vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
               *)local_a8);
    local_c8._M_value.
    super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    *(MultisigDescriptor **)this = this_01;
    std::
    unique_ptr<(anonymous_namespace)::MultisigDescriptor,_std::default_delete<(anonymous_namespace)::MultisigDescriptor>_>
    ::~unique_ptr((unique_ptr<(anonymous_namespace)::MultisigDescriptor,_std::default_delete<(anonymous_namespace)::MultisigDescriptor>_>
                   *)&local_c8._M_value);
    std::
    vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
    ::~vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
               *)&local_138._M_first);
    goto LAB_006fc206;
  case WITNESS_V0_KEYHASH:
    if (ctx < P2WPKH) {
      puVar5 = ((local_178.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)((local_178.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar5 != 0x14) goto LAB_006fc262;
      local_138._16_4_ = *(undefined4 *)(puVar5 + 0x10);
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)*(undefined8 *)puVar5;
      local_138._0_8_ = *(undefined8 *)puVar5;
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)*(undefined8 *)(puVar5 + 8);
      local_138._8_8_ = *(undefined8 *)(puVar5 + 8);
      local_c8._16_4_ = *(undefined4 *)(puVar5 + 0x10);
      local_a8[0] = 0xff;
      iVar13 = (*provider->_vptr_SigningProvider[4])();
      if (((char)iVar13 != '\0') &&
         (InferPubkey((anon_unknown_dwarf_2e1d52a *)&local_e8.indirect_contents,(CPubKey *)local_a8,
                      P2WPKH,provider),
         (Node<unsigned_int> *)local_e8.indirect_contents.indirect != (Node<unsigned_int> *)0x0)) {
        std::
        make_unique<(anonymous_namespace)::WPKHDescriptor,std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
                  ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                    *)&local_158);
        piVar7 = local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        *(pointer *)this = piVar7;
        std::
        unique_ptr<(anonymous_namespace)::WPKHDescriptor,_std::default_delete<(anonymous_namespace)::WPKHDescriptor>_>
        ::~unique_ptr((unique_ptr<(anonymous_namespace)::WPKHDescriptor,_std::default_delete<(anonymous_namespace)::WPKHDescriptor>_>
                       *)&local_158);
        goto LAB_006fb740;
      }
    }
  }
  if (ctx < P2WPKH && TVar12 == WITNESS_V0_SCRIPTHASH) {
    data_00 = ((local_178.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar5 = ((local_178.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    local_c8._M_value.
    super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8._M_value.
    super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8._M_value.
    super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)local_c8._M_value.
                          super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
    CRIPEMD160::CRIPEMD160((CRIPEMD160 *)local_a8);
    this_02 = CRIPEMD160::Write((CRIPEMD160 *)local_a8,data_00,(long)puVar5 - (long)data_00);
    CRIPEMD160::Finalize(this_02,local_c8.field2);
    local_138._0_8_ =
         local_c8._M_value.
         super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_138._8_8_ =
         local_c8._M_value.
         super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_138._16_4_ = local_c8._16_4_;
    local_a8._16_8_ = (Node<unsigned_int> *)0x0;
    local_a8._24_8_ = (Node<unsigned_int> *)0x0;
    local_a8._0_8_ = (Node<unsigned_int> *)0x0;
    local_a8._8_8_ = (Node<unsigned_int> *)0x0;
    iVar13 = (*provider->_vptr_SigningProvider[2])();
    if (((char)iVar13 == '\0') ||
       (InferScript((anon_unknown_dwarf_2e1d52a *)&local_c8._M_value,(CScript *)local_a8,P2WSH,
                    provider),
       (Node<unsigned_int> *)
       local_c8._M_value.
       super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_start == (Node<unsigned_int> *)0x0)) {
      if (0x1c < (uint)local_a8._28_4_) {
        free((void *)local_a8._0_8_);
      }
joined_r0x006fc0a7:
      if (ctx == TOP) {
LAB_006fc0ad:
        local_138._16_8_ = (Node<unsigned_int> *)0x0;
        local_138._24_8_ = 0;
        local_138._0_8_ = (Node<unsigned_int> *)0x0;
        local_138._8_8_ = (Node<unsigned_int> *)0x0;
        local_f0 = '\0';
        bVar11 = ExtractDestination(script,(CTxDestination *)&local_138._M_first);
        if (bVar11) {
          GetScriptForDestination((CScript *)local_a8,(CTxDestination *)&local_138._M_first);
          bVar11 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                             ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,
                              &script->super_CScriptBase);
          if (0x1c < (uint)local_a8._28_4_) {
            free((void *)local_a8._0_8_);
          }
          if (!bVar11) goto LAB_006fc18b;
          this_05 = (AddressDescriptor *)operator_new(0xa8);
          local_60 = CONCAT31(local_60._1_3_,local_f0);
          local_c8._M_value.
          super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)(Node<unsigned_int> *)local_a8;
          (*::wallet::_GLOBAL__N_1::std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&&>
            ::_S_vtable._M_arr[(long)local_f0 + 1]._M_data)
                    ((anon_class_8_1_a78179b7_conflict *)&local_c8._M_value,
                     (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      *)&local_138._M_first);
          AddressDescriptor::AddressDescriptor(this_05,(CTxDestination *)local_a8);
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)local_a8);
          local_e8.indirect_contents.indirect = (char *)0x0;
          *(AddressDescriptor **)this = this_05;
          std::
          unique_ptr<(anonymous_namespace)::AddressDescriptor,_std::default_delete<(anonymous_namespace)::AddressDescriptor>_>
          ::~unique_ptr((unique_ptr<(anonymous_namespace)::AddressDescriptor,_std::default_delete<(anonymous_namespace)::AddressDescriptor>_>
                         *)&local_e8.indirect_contents);
        }
        else {
LAB_006fc18b:
          this_06 = (RawDescriptor *)operator_new(0x78);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,
                     &script->super_CScriptBase);
          RawDescriptor::RawDescriptor(this_06,(CScript *)local_a8);
          if (0x1c < (uint)local_a8._28_4_) {
            free((void *)local_a8._0_8_);
          }
          local_c8._M_value.
          super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          *(RawDescriptor **)this = this_06;
          std::
          unique_ptr<(anonymous_namespace)::RawDescriptor,_std::default_delete<(anonymous_namespace)::RawDescriptor>_>
          ::~unique_ptr((unique_ptr<(anonymous_namespace)::RawDescriptor,_std::default_delete<(anonymous_namespace)::RawDescriptor>_>
                         *)&local_c8._M_value);
        }
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_138._M_first);
      }
      else {
        *(undefined8 *)this = 0;
      }
    }
    else {
      std::
      make_unique<(anonymous_namespace)::WSHDescriptor,std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>>
                ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                  *)&local_e8.indirect_contents);
      uVar17 = local_e8.indirect_contents.indirect;
      local_e8.indirect_contents.indirect = (char *)0x0;
      *(undefined8 *)this = uVar17;
      std::
      unique_ptr<(anonymous_namespace)::WSHDescriptor,_std::default_delete<(anonymous_namespace)::WSHDescriptor>_>
      ::~unique_ptr((unique_ptr<(anonymous_namespace)::WSHDescriptor,_std::default_delete<(anonymous_namespace)::WSHDescriptor>_>
                     *)&local_e8.indirect_contents);
      uVar17 = local_c8._M_value.
               super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
LAB_006fbb7c:
      if ((Node<unsigned_int> *)uVar17 != (Node<unsigned_int> *)0x0) {
        (**(code **)(*(long *)uVar17 + 8))();
      }
      if (0x1c < (uint)local_a8._28_4_) {
        free((void *)local_a8._0_8_);
      }
    }
  }
  else {
    if (ctx != TOP || TVar12 != WITNESS_V1_TAPROOT) {
LAB_006fbdcb:
      if (ctx - P2WSH < 2) {
        local_a8._0_8_ = (Node<unsigned_int> *)0x0;
        local_a8._16_8_ = (Node<unsigned_int> *)0x0;
        local_a8._24_8_ = (Node<unsigned_int> *)0x0;
        local_a8._32_8_ = (pointer)0x0;
        local_a8._48_8_ = (pointer)0x0;
        auStack_70._0_8_ = auStack_70._0_8_ & 0xffffffffffffff00;
        local_60 = (MiniscriptContext)(ctx != P2WSH);
        local_5c = 0;
        uVar2 = (script->super_CScriptBase)._size;
        uVar16 = 0xe10;
        if (ctx != P2WSH) {
          uVar16 = 0x5070a;
        }
        uVar15 = uVar2 - 0x1d;
        if (uVar2 < 0x1d) {
          uVar15 = uVar2;
        }
        local_a8._8_8_ = provider;
        local_a8._40_8_ = auStack_70;
        if (uVar15 <= uVar16) {
          miniscript::internal::DecomposeScript
                    ((optional<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                      *)&local_138._M_first,script);
          if (local_138._M_first._M_storage._M_storage[0x18] == 1) {
            local_e8.indirect_contents.indirect = (char *)local_138._0_8_;
            miniscript::internal::
            DecodeScript<unsigned_int,(anonymous_namespace)::KeyParser,__gnu_cxx::__normal_iterator<std::pair<opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>>*,std::vector<std::pair<opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>>
                      ((internal *)&local_c8._M_value,
                       (__normal_iterator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                        *)&local_e8.indirect_contents,
                       (__normal_iterator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                        )local_138._8_8_,(KeyParser *)local_a8);
            uVar17 = local_c8._M_value.
                     super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (((Node<unsigned_int> *)
                 local_c8._M_value.
                 super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == (Node<unsigned_int> *)0x0) ||
               (local_e8.indirect_contents.indirect != (char *)local_138._8_8_)) {
              uVar17 = (Node<unsigned_int> *)0x0;
              uVar18 = (Node<unsigned_int> *)0x0;
            }
            else {
              local_c8._M_value.
              super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              uVar18 = local_c8._M_value.
                       super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            }
            if ((Node<unsigned_int> *)
                local_c8._M_value.
                super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != (Node<unsigned_int> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_c8._M_value.
                         super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
          }
          else {
            uVar18 = (Node<unsigned_int> *)0x0;
            uVar17 = (Node<unsigned_int> *)0x0;
          }
          if ((local_138._M_first._M_storage._M_storage[0x18] & 1) != 0) {
            local_138._24_8_ = local_138._24_8_ & 0xffffffffffffff00;
            std::
            vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::~vector((vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       *)&local_138._M_first);
          }
          if (((Node<unsigned_int> *)uVar18 != (Node<unsigned_int> *)0x0) &&
             (bVar11 = miniscript::Node<unsigned_int>::IsSane((Node<unsigned_int> *)uVar18), bVar11)
             ) {
            local_c8._M_value.
            super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_c8._M_value.
            super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_c8._M_value.
            super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
            ::reserve((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                       *)&local_c8._M_value,
                      ((long)(local_a8._24_8_ - local_a8._16_8_) >> 3) * -0x5555555555555555);
            uVar9 = local_a8._24_8_;
            if (local_a8._16_8_ != local_a8._24_8_) {
              pNVar20 = (Node<unsigned_int> *)local_a8._16_8_;
              do {
                if ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                     *)(pNVar20->keys).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start ==
                    *(unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                      **)pNVar20) {
                  if ((tuple<(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                       )*(DescriptorImpl **)(in_FS_OFFSET + 0x28) !=
                      (_Tuple_impl<0UL,_(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                       )local_38._M_t.
                        super__Tuple_impl<0UL,_(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                        .super__Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false>.
                        _M_head_impl) goto LAB_006fc778;
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,0,0);
                  goto LAB_006fc262;
                }
                std::
                vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                ::
                emplace_back<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
                          ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                            *)&local_c8._M_value,
                           *(unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                             **)pNVar20);
                pNVar20 = (Node<unsigned_int> *)
                          &(pNVar20->keys).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
              } while (pNVar20 != (Node<unsigned_int> *)uVar9);
            }
            this_04 = (MiniscriptDescriptor *)operator_new(0x68);
            local_138._0_8_ =
                 local_c8._M_value.
                 super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_138._8_8_ =
                 local_c8._M_value.
                 super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_138._16_8_ =
                 local_c8._M_value.
                 super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_c8._M_value.
            super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_c8._M_value.
            super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_c8._M_value.
            super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_e8.indirect_contents.indirect = (char *)uVar18;
            local_e8._8_8_ = uVar17;
            MiniscriptDescriptor::MiniscriptDescriptor
                      (this_04,(vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                                *)&local_138._M_first,
                       (NodeRef<uint32_t> *)&local_e8.indirect_contents);
            if ((Node<unsigned_int> *)local_e8._8_8_ != (Node<unsigned_int> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
            }
            std::
            vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
            ::~vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                       *)&local_138._M_first);
            local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            *(MiniscriptDescriptor **)this = this_04;
            std::
            unique_ptr<(anonymous_namespace)::MiniscriptDescriptor,_std::default_delete<(anonymous_namespace)::MiniscriptDescriptor>_>
            ::~unique_ptr((unique_ptr<(anonymous_namespace)::MiniscriptDescriptor,_std::default_delete<(anonymous_namespace)::MiniscriptDescriptor>_>
                           *)&local_158);
            std::
            vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
            ::~vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                       *)&local_c8._M_value);
            if ((undefined1 *)local_a8._40_8_ != auStack_70) {
              operator_delete((void *)local_a8._40_8_,auStack_70._0_8_ + 1);
            }
            std::
            vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
            ::~vector((vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                       *)(local_a8 + 0x10));
            goto LAB_006fc206;
          }
          if ((Node<unsigned_int> *)uVar17 != (Node<unsigned_int> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17);
          }
        }
        if ((undefined1 *)local_a8._40_8_ != auStack_70) {
          operator_delete((void *)local_a8._40_8_,auStack_70._0_8_ + 1);
        }
        std::
        vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
        ::~vector((vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                   *)(local_a8 + 0x10));
      }
      goto joined_r0x006fc0a7;
    }
    local_138._16_8_ = (Node<unsigned_int> *)0x0;
    local_138._24_8_ = 0;
    local_138._0_8_ = (Node<unsigned_int> *)0x0;
    local_138._8_8_ = (Node<unsigned_int> *)0x0;
    puVar5 = ((local_178.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __n = (long)((local_178.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar5;
    if (__n != 0) {
      memmove(&local_138,puVar5,__n);
    }
    local_50 = (MaxInt<unsigned_int>)&local_60;
    local_60 = P2WSH;
    local_58 = (_Base_ptr)0x0;
    local_a8._0_8_ = (Node<unsigned_int> *)0x0;
    local_a8._8_8_ = (Node<unsigned_int> *)0x0;
    local_a8._16_8_ = (Node<unsigned_int> *)0x0;
    local_a8._24_8_ = (Node<unsigned_int> *)0x0;
    local_a8._32_8_ = (pointer)0x0;
    local_a8._40_8_ = (pointer)0x0;
    local_a8._48_8_ = (pointer)0x0;
    auStack_70._0_8_ = 0;
    local_40 = 0;
    local_48 = local_50;
    iVar13 = (*provider->_vptr_SigningProvider[8])(provider,&local_138,local_a8);
    if ((char)iVar13 == '\0') {
LAB_006fbd30:
      bVar11 = XOnlyPubKey::IsFullyValid((XOnlyPubKey *)&local_138._M_first);
      if ((!bVar11) ||
         (InferXOnlyPubkey((XOnlyPubKey *)&local_c8._M_value,(ParseScriptContext)&local_138,provider
                          ),
         (Node<unsigned_int> *)
         local_c8._M_value.
         super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start == (Node<unsigned_int> *)0x0)) {
        std::
        _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                     *)(auStack_70 + 8));
        goto LAB_006fbdcb;
      }
      std::
      make_unique<(anonymous_namespace)::RawTRDescriptor,std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
                ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                  *)&local_e8.indirect_contents);
      uVar17 = local_e8.indirect_contents.indirect;
      local_e8.indirect_contents.indirect = (char *)0x0;
      *(undefined8 *)this = uVar17;
      std::
      unique_ptr<(anonymous_namespace)::RawTRDescriptor,_std::default_delete<(anonymous_namespace)::RawTRDescriptor>_>
      ::~unique_ptr((unique_ptr<(anonymous_namespace)::RawTRDescriptor,_std::default_delete<(anonymous_namespace)::RawTRDescriptor>_>
                     *)&local_e8.indirect_contents);
      if ((Node<unsigned_int> *)
          local_c8._M_value.
          super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (Node<unsigned_int> *)0x0) {
        (**(code **)((((direct_or_indirect *)
                      &(local_c8._M_value.
                        super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                       super__Tuple_impl<0UL,_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>
                      )->indirect_contents).indirect + 8))();
      }
    }
    else {
      InferTaprootTree((optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                        *)&local_c8._M_value,(TaprootSpendData *)local_a8,
                       (XOnlyPubKey *)&local_138._M_first);
      uVar17 = local_c8._M_value.
               super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_b0 != 1) {
LAB_006fbd1b:
        if ((local_b0 & 1) != 0) {
          local_b0 = 0;
          std::
          vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
          ::~vector(&local_c8._M_value);
        }
        goto LAB_006fbd30;
      }
      local_198.
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_198.
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_198.
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1a8 = (int *)0x0;
      local_1b8 = (PubkeyProvider *)0x0;
      iStack_1b0._M_current = (int *)0x0;
      if (local_c8._M_value.
          super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_c8._M_value.
          super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (*(int *)&(local_c8._M_value.
                      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super__Tuple_impl<0UL,_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>
            == 0xc0) {
          bVar11 = true;
          uVar18 = local_c8._M_value.
                   super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            prevector<28U,_unsigned_char,_unsigned_int,_int>::
            prevector<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                       &local_e8.indirect_contents,
                       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )(((Node<unsigned_int> *)uVar18)->keys).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )(((Node<unsigned_int> *)uVar18)->keys).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
            InferScript((anon_unknown_dwarf_2e1d52a *)&local_140,
                        (CScript *)&local_e8.indirect_contents,P2TR,provider);
            _Var8._M_head_impl = local_140._M_head_impl;
            local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)local_140._M_head_impl;
            if (0x1c < local_cc) {
              free(local_e8.indirect_contents.indirect);
            }
            if (_Var8._M_head_impl == (PubkeyProvider *)0x0) {
              bVar11 = false;
            }
            else {
              std::
              vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>,std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>>>
              ::
              emplace_back<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>>
                        ((vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>,std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>>>
                          *)&local_198,
                         (unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                          *)&local_158);
              if (iStack_1b0._M_current == local_1a8) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_1b8,iStack_1b0,
                           (int *)&((Node<unsigned_int> *)uVar18)->data);
              }
              else {
                *iStack_1b0._M_current =
                     *(int *)&(((Node<unsigned_int> *)uVar18)->data).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                iStack_1b0._M_current = iStack_1b0._M_current + 1;
              }
            }
            if ((PubkeyProvider *)
                local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (PubkeyProvider *)0x0) {
              (*(*(_func_int ***)
                  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start)[1])();
            }
            if ((_Var8._M_head_impl == (PubkeyProvider *)0x0) ||
               (uVar18 = &(((Node<unsigned_int> *)uVar18)->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish, uVar18 == uVar17)) {
              if (bVar11) goto LAB_006fbbd2;
              break;
            }
          } while (*(int *)uVar18 == 0xc0);
        }
        if (local_1b8 != (PubkeyProvider *)0x0) {
          operator_delete(local_1b8,(long)local_1a8 - (long)local_1b8);
        }
        std::
        vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
        ::~vector(&local_198);
        goto LAB_006fbd1b;
      }
LAB_006fbbd2:
      InferXOnlyPubkey((XOnlyPubKey *)&local_1c0,(ParseScriptContext)local_a8,provider);
      this_03 = (TRDescriptor *)operator_new(0x70);
      local_140._M_head_impl = local_1c0;
      local_e8.indirect_contents.indirect =
           (char *)local_198.
                   super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      local_e8._8_8_ =
           local_198.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_e8._16_8_ =
           local_198.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_198.
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_198.
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_198.
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_1b8;
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = iStack_1b0._M_current;
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = local_1a8;
      local_1b8 = (PubkeyProvider *)0x0;
      iStack_1b0._M_current = (int *)0x0;
      local_1a8 = (int *)0x0;
      TRDescriptor::TRDescriptor
                (this_03,(unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                          *)&local_140,
                 (vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                  *)&local_e8.indirect_contents,&local_158);
      if ((PubkeyProvider *)
          local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (PubkeyProvider *)0x0) {
        operator_delete(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
      ::~vector((vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                 *)&local_e8.indirect_contents);
      if (local_140._M_head_impl != (PubkeyProvider *)0x0) {
        (*(local_140._M_head_impl)->_vptr_PubkeyProvider[1])();
      }
      local_1c8._M_head_impl = (TRDescriptor *)0x0;
      *(TRDescriptor **)this = this_03;
      std::
      unique_ptr<(anonymous_namespace)::TRDescriptor,_std::default_delete<(anonymous_namespace)::TRDescriptor>_>
      ::~unique_ptr((unique_ptr<(anonymous_namespace)::TRDescriptor,_std::default_delete<(anonymous_namespace)::TRDescriptor>_>
                     *)&local_1c8);
      if (local_1b8 != (PubkeyProvider *)0x0) {
        operator_delete(local_1b8,(long)local_1a8 - (long)local_1b8);
      }
      std::
      vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
      ::~vector(&local_198);
      if (local_b0 == 1) {
        local_b0 = 0;
        std::
        vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
        ::~vector(&local_c8._M_value);
      }
    }
    std::
    _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                 *)(auStack_70 + 8));
  }
LAB_006fc206:
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_178);
LAB_006fc210:
  _Var6.super__Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false>._M_head_impl =
       ((_Tuple_impl<0UL,_(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
         *)(in_FS_OFFSET + 0x28))->
       super__Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false>;
  if (_Var6.super__Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false>._M_head_impl ==
      (_Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false>)
      local_38._M_t.
      super__Tuple_impl<0UL,_(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
      .super__Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false>._M_head_impl) {
    return (__uniq_ptr_data<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>,_true,_true>
            )(tuple<(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
              )_Var6.super__Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false>.
               _M_head_impl;
  }
LAB_006fc778:
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<DescriptorImpl> InferScript(const CScript& script, ParseScriptContext ctx, const SigningProvider& provider)
{
    if (ctx == ParseScriptContext::P2TR && script.size() == 34 && script[0] == 32 && script[33] == OP_CHECKSIG) {
        XOnlyPubKey key{Span{script}.subspan(1, 32)};
        return std::make_unique<PKDescriptor>(InferXOnlyPubkey(key, ctx, provider), true);
    }

    if (ctx == ParseScriptContext::P2TR) {
        auto ret = InferMultiA(script, ctx, provider);
        if (ret) return ret;
    }

    std::vector<std::vector<unsigned char>> data;
    TxoutType txntype = Solver(script, data);

    if (txntype == TxoutType::PUBKEY && (ctx == ParseScriptContext::TOP || ctx == ParseScriptContext::P2SH || ctx == ParseScriptContext::P2WSH)) {
        CPubKey pubkey(data[0]);
        if (auto pubkey_provider = InferPubkey(pubkey, ctx, provider)) {
            return std::make_unique<PKDescriptor>(std::move(pubkey_provider));
        }
    }
    if (txntype == TxoutType::PUBKEYHASH && (ctx == ParseScriptContext::TOP || ctx == ParseScriptContext::P2SH || ctx == ParseScriptContext::P2WSH)) {
        uint160 hash(data[0]);
        CKeyID keyid(hash);
        CPubKey pubkey;
        if (provider.GetPubKey(keyid, pubkey)) {
            if (auto pubkey_provider = InferPubkey(pubkey, ctx, provider)) {
                return std::make_unique<PKHDescriptor>(std::move(pubkey_provider));
            }
        }
    }
    if (txntype == TxoutType::WITNESS_V0_KEYHASH && (ctx == ParseScriptContext::TOP || ctx == ParseScriptContext::P2SH)) {
        uint160 hash(data[0]);
        CKeyID keyid(hash);
        CPubKey pubkey;
        if (provider.GetPubKey(keyid, pubkey)) {
            if (auto pubkey_provider = InferPubkey(pubkey, ParseScriptContext::P2WPKH, provider)) {
                return std::make_unique<WPKHDescriptor>(std::move(pubkey_provider));
            }
        }
    }
    if (txntype == TxoutType::MULTISIG && (ctx == ParseScriptContext::TOP || ctx == ParseScriptContext::P2SH || ctx == ParseScriptContext::P2WSH)) {
        bool ok = true;
        std::vector<std::unique_ptr<PubkeyProvider>> providers;
        for (size_t i = 1; i + 1 < data.size(); ++i) {
            CPubKey pubkey(data[i]);
            if (auto pubkey_provider = InferPubkey(pubkey, ctx, provider)) {
                providers.push_back(std::move(pubkey_provider));
            } else {
                ok = false;
                break;
            }
        }
        if (ok) return std::make_unique<MultisigDescriptor>((int)data[0][0], std::move(providers));
    }
    if (txntype == TxoutType::SCRIPTHASH && ctx == ParseScriptContext::TOP) {
        uint160 hash(data[0]);
        CScriptID scriptid(hash);
        CScript subscript;
        if (provider.GetCScript(scriptid, subscript)) {
            auto sub = InferScript(subscript, ParseScriptContext::P2SH, provider);
            if (sub) return std::make_unique<SHDescriptor>(std::move(sub));
        }
    }
    if (txntype == TxoutType::WITNESS_V0_SCRIPTHASH && (ctx == ParseScriptContext::TOP || ctx == ParseScriptContext::P2SH)) {
        CScriptID scriptid{RIPEMD160(data[0])};
        CScript subscript;
        if (provider.GetCScript(scriptid, subscript)) {
            auto sub = InferScript(subscript, ParseScriptContext::P2WSH, provider);
            if (sub) return std::make_unique<WSHDescriptor>(std::move(sub));
        }
    }
    if (txntype == TxoutType::WITNESS_V1_TAPROOT && ctx == ParseScriptContext::TOP) {
        // Extract x-only pubkey from output.
        XOnlyPubKey pubkey;
        std::copy(data[0].begin(), data[0].end(), pubkey.begin());
        // Request spending data.
        TaprootSpendData tap;
        if (provider.GetTaprootSpendData(pubkey, tap)) {
            // If found, convert it back to tree form.
            auto tree = InferTaprootTree(tap, pubkey);
            if (tree) {
                // If that works, try to infer subdescriptors for all leaves.
                bool ok = true;
                std::vector<std::unique_ptr<DescriptorImpl>> subscripts; //!< list of script subexpressions
                std::vector<int> depths; //!< depth in the tree of each subexpression (same length subscripts)
                for (const auto& [depth, script, leaf_ver] : *tree) {
                    std::unique_ptr<DescriptorImpl> subdesc;
                    if (leaf_ver == TAPROOT_LEAF_TAPSCRIPT) {
                        subdesc = InferScript(CScript(script.begin(), script.end()), ParseScriptContext::P2TR, provider);
                    }
                    if (!subdesc) {
                        ok = false;
                        break;
                    } else {
                        subscripts.push_back(std::move(subdesc));
                        depths.push_back(depth);
                    }
                }
                if (ok) {
                    auto key = InferXOnlyPubkey(tap.internal_key, ParseScriptContext::P2TR, provider);
                    return std::make_unique<TRDescriptor>(std::move(key), std::move(subscripts), std::move(depths));
                }
            }
        }
        // If the above doesn't work, construct a rawtr() descriptor with just the encoded x-only pubkey.
        if (pubkey.IsFullyValid()) {
            auto key = InferXOnlyPubkey(pubkey, ParseScriptContext::P2TR, provider);
            if (key) {
                return std::make_unique<RawTRDescriptor>(std::move(key));
            }
        }
    }

    if (ctx == ParseScriptContext::P2WSH || ctx == ParseScriptContext::P2TR) {
        const auto script_ctx{ctx == ParseScriptContext::P2WSH ? miniscript::MiniscriptContext::P2WSH : miniscript::MiniscriptContext::TAPSCRIPT};
        KeyParser parser(/* out = */nullptr, /* in = */&provider, /* ctx = */script_ctx);
        auto node = miniscript::FromScript(script, parser);
        if (node && node->IsSane()) {
            std::vector<std::unique_ptr<PubkeyProvider>> keys;
            keys.reserve(parser.m_keys.size());
            for (auto& key : parser.m_keys) {
                keys.emplace_back(std::move(key.at(0)));
            }
            return std::make_unique<MiniscriptDescriptor>(std::move(keys), std::move(node));
        }
    }

    // The following descriptors are all top-level only descriptors.
    // So if we are not at the top level, return early.
    if (ctx != ParseScriptContext::TOP) return nullptr;

    CTxDestination dest;
    if (ExtractDestination(script, dest)) {
        if (GetScriptForDestination(dest) == script) {
            return std::make_unique<AddressDescriptor>(std::move(dest));
        }
    }

    return std::make_unique<RawDescriptor>(script);
}